

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  
  pfVar1 = (source->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  if (lVar3 == (long)(source->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar1) {
    lVar3 = lVar3 >> 2;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        pfVar2[lVar4] = pfVar1[lVar4] + pfVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,0x32,"void fasttext::Vector::addVector(const Vector &)");
}

Assistant:

void Vector::addVector(const Vector& source) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += source.data_[i];
  }
}